

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginMainMenuBar(void)

{
  ImVec2 IVar1;
  ImGuiViewportP *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiViewportP **ppIVar6;
  ImGuiWindow *pIVar7;
  float fVar8;
  ImVec2 menu_bar_pos;
  ImVec2 local_30;
  ImVec2 menu_bar_size;
  
  pIVar3 = GImGui;
  ppIVar6 = ImVector<ImGuiViewportP_*>::operator[](&GImGui->Viewports,0);
  pIVar2 = *ppIVar6;
  pIVar7 = FindWindowByName("##MainMenuBar");
  fVar8 = (pIVar3->Style).DisplaySafeAreaPadding.y - (pIVar3->Style).FramePadding.y;
  (pIVar3->NextWindowData).MenuBarOffsetMinVal.x = (pIVar3->Style).DisplaySafeAreaPadding.x;
  (pIVar3->NextWindowData).MenuBarOffsetMinVal.y = (float)(-(uint)(0.0 <= fVar8) & (uint)fVar8);
  if ((pIVar7 == (ImGuiWindow *)0x0) || (pIVar7->BeginCount == 0)) {
    IVar1 = (pIVar2->super_ImGuiViewport).Pos;
    fVar8 = (pIVar2->CurrWorkOffsetMin).x;
    menu_bar_pos.x = IVar1.x + fVar8;
    menu_bar_pos.y = IVar1.y + (pIVar2->CurrWorkOffsetMin).y;
    menu_bar_size.x = ((pIVar2->super_ImGuiViewport).Size.x - fVar8) + (pIVar2->CurrWorkOffsetMax).x
    ;
    menu_bar_size.y = 1.0;
    local_30.x = 0.0;
    local_30.y = 0.0;
    SetNextWindowPos(&menu_bar_pos,0,&local_30);
    SetNextWindowSize(&menu_bar_size,0);
  }
  SetNextWindowViewport((pIVar2->super_ImGuiViewport).ID);
  PushStyleVar(2,0.0);
  menu_bar_pos.x = 0.0;
  menu_bar_pos.y = 0.0;
  PushStyleVar(4,&menu_bar_pos);
  bVar5 = false;
  bVar4 = Begin("##MainMenuBar",(bool *)0x0,0x20050f);
  if (bVar4) {
    bVar5 = BeginMenuBar();
  }
  PopStyleVar(2);
  pIVar7 = GImGui->CurrentWindow;
  pIVar7->WriteAccessed = true;
  if (pIVar7->BeginCount == 1) {
    (pIVar2->CurrWorkOffsetMin).y = (pIVar7->Size).y + (pIVar2->CurrWorkOffsetMin).y;
  }
  (pIVar3->NextWindowData).MenuBarOffsetMinVal.x = 0.0;
  (pIVar3->NextWindowData).MenuBarOffsetMinVal.y = 0.0;
  if (bVar5 == false) {
    End();
  }
  return bVar5;
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = g.Viewports[0];
    ImGuiWindow* menu_bar_window = FindWindowByName("##MainMenuBar");

    // For the main menu bar, which cannot be moved, we honor g.Style.DisplaySafeAreaPadding to ensure text can be visible on a TV set.
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));

    // Get our rectangle at the top of the work area
    if (menu_bar_window == NULL || menu_bar_window->BeginCount == 0)
    {
        // Set window position
        // We don't attempt to calculate our height ahead, as it depends on the per-viewport font size. However menu-bar will affect the minimum window size so we'll get the right height.
        ImVec2 menu_bar_pos = viewport->Pos + viewport->CurrWorkOffsetMin;
        ImVec2 menu_bar_size = ImVec2(viewport->Size.x - viewport->CurrWorkOffsetMin.x + viewport->CurrWorkOffsetMax.x, 1.0f);
        SetNextWindowPos(menu_bar_pos);
        SetNextWindowSize(menu_bar_size);
    }

    // Create window
    SetNextWindowViewport(viewport->ID); // Enforce viewport so we don't create our own viewport when ImGuiConfigFlags_ViewportsNoMerge is set.
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0));    // Lift normal size constraint, however the presence of a menu-bar will give us the minimum height we want.
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoDocking | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    bool is_open = Begin("##MainMenuBar", NULL, window_flags) && BeginMenuBar();
    PopStyleVar(2);

    // Report our size into work area (for next frame) using actual window size
    menu_bar_window = GetCurrentWindow();
    if (menu_bar_window->BeginCount == 1)
        viewport->CurrWorkOffsetMin.y += menu_bar_window->Size.y;

    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    if (!is_open)
    {
        End();
        return false;
    }
    return true; //-V1020
}